

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_split.cpp
# Opt level: O2

bool __thiscall BamTools::SplitTool::SplitToolPrivate::SplitReference(SplitToolPrivate *this)

{
  _Rb_tree_header *p_Var1;
  bool bVar2;
  bool bVar3;
  long lVar4;
  iterator iVar5;
  _Base_ptr this_00;
  ostream *poVar6;
  int32_t currentRefId;
  string refName;
  string refPrefix;
  string outputFilename;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  map<int,_BamTools::BamWriter_*,_std::less<int>,_std::allocator<std::pair<const_int,_BamTools::BamWriter_*>_>_>
  outputFiles;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  BamAlignment al;
  
  p_Var1 = &outputFiles._M_t._M_impl.super__Rb_tree_header;
  outputFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  outputFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  outputFiles._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  outputFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  outputFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  std::__cxx11::string::string((string *)&refPrefix,(string *)SPLIT_REFERENCE_TOKEN_abi_cxx11_);
  if (this->m_settings->HasCustomRefPrefix == true) {
    std::__cxx11::string::_M_assign((string *)&refPrefix);
  }
  lVar4 = std::__cxx11::string::find((char)&refPrefix,0x2e);
  if (lVar4 != 0) {
    refName._M_dataplus._M_p = (pointer)&refName.field_2;
    std::__cxx11::string::_M_construct((ulong)&refName,'\x01');
    std::operator+(&al.Name,&refName,&refPrefix);
    std::__cxx11::string::operator=((string *)&refPrefix,(string *)&al);
    std::__cxx11::string::~string((string *)&al);
    std::__cxx11::string::~string((string *)&refName);
  }
  BamAlignment::BamAlignment(&al);
LAB_0017ecaa:
  bVar2 = BamReader::GetNextAlignment(&this->m_reader,&al);
  if (bVar2) {
    currentRefId = al.RefID;
    iVar5 = std::
            _Rb_tree<int,_std::pair<const_int,_BamTools::BamWriter_*>,_std::_Select1st<std::pair<const_int,_BamTools::BamWriter_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_BamTools::BamWriter_*>_>_>
            ::find(&outputFiles._M_t,&currentRefId);
    if ((_Rb_tree_header *)iVar5._M_node != p_Var1) goto code_r0x0017ece6;
    refName._M_dataplus._M_p = (pointer)&refName.field_2;
    refName._M_string_length = 0;
    refName.field_2._M_local_buf[0] = '\0';
    if ((long)currentRefId == 0xffffffffffffffff) {
      std::__cxx11::string::assign((char *)&refName);
    }
    else {
      std::vector<BamTools::RefData,_std::allocator<BamTools::RefData>_>::at
                (&this->m_references,(long)currentRefId);
      std::__cxx11::string::_M_assign((string *)&refName);
    }
    std::operator+(&local_1a8,&this->m_outputFilenameStub,&refPrefix);
    std::operator+(&local_1f8,&local_1a8,&refName);
    std::operator+(&outputFilename,&local_1f8,".bam");
    std::__cxx11::string::~string((string *)&local_1f8);
    std::__cxx11::string::~string((string *)&local_1a8);
    this_00 = (_Base_ptr)operator_new(8);
    BamWriter::BamWriter((BamWriter *)this_00);
    bVar3 = BamWriter::Open((BamWriter *)this_00,&outputFilename,&this->m_header,&this->m_references
                           );
    if (bVar3) {
      local_1f8._M_dataplus._M_p._0_4_ = currentRefId;
      local_1f8._M_string_length = (size_type)this_00;
      std::
      _Rb_tree<int,std::pair<int_const,BamTools::BamWriter*>,std::_Select1st<std::pair<int_const,BamTools::BamWriter*>>,std::less<int>,std::allocator<std::pair<int_const,BamTools::BamWriter*>>>
      ::_M_emplace_unique<std::pair<int,BamTools::BamWriter*>>
                ((_Rb_tree<int,std::pair<int_const,BamTools::BamWriter*>,std::_Select1st<std::pair<int_const,BamTools::BamWriter*>>,std::less<int>,std::allocator<std::pair<int_const,BamTools::BamWriter*>>>
                  *)&outputFiles,(pair<int,_BamTools::BamWriter_*> *)&local_1f8);
    }
    else {
      poVar6 = std::operator<<((ostream *)&std::cerr,"bamtools split ERROR: could not open ");
      poVar6 = std::operator<<(poVar6,(string *)&outputFilename);
      poVar6 = std::operator<<(poVar6," for writing.");
      std::endl<char,std::char_traits<char>>(poVar6);
    }
    std::__cxx11::string::~string((string *)&outputFilename);
    std::__cxx11::string::~string((string *)&refName);
    if (bVar3) goto LAB_0017ee3e;
  }
  else {
    CloseWriters<int>(this,&outputFiles);
  }
  BamAlignment::~BamAlignment(&al);
  std::__cxx11::string::~string((string *)&refPrefix);
  std::
  _Rb_tree<int,_std::pair<const_int,_BamTools::BamWriter_*>,_std::_Select1st<std::pair<const_int,_BamTools::BamWriter_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_BamTools::BamWriter_*>_>_>
  ::~_Rb_tree(&outputFiles._M_t);
  return !bVar2;
code_r0x0017ece6:
  this_00 = iVar5._M_node[1]._M_parent;
  if (this_00 != (_Base_ptr)0x0) {
LAB_0017ee3e:
    BamWriter::SaveAlignment((BamWriter *)this_00,&al);
  }
  goto LAB_0017ecaa;
}

Assistant:

bool SplitTool::SplitToolPrivate::SplitReference()
{

    // set up splitting data structure
    std::map<int32_t, BamWriter*> outputFiles;
    std::map<int32_t, BamWriter*>::iterator writerIter;

    // determine reference prefix
    std::string refPrefix = SPLIT_REFERENCE_TOKEN;
    if (m_settings->HasCustomRefPrefix) refPrefix = m_settings->CustomRefPrefix;

    // make sure prefix starts with '.'
    const std::size_t dotFound = refPrefix.find('.');
    if (dotFound != 0) refPrefix = std::string(1, '.') + refPrefix;

    // iterate through alignments
    BamAlignment al;
    BamWriter* writer;
    int32_t currentRefId;
    while (m_reader.GetNextAlignment(al)) {

        // see if bool value exists
        currentRefId = al.RefID;
        writerIter = outputFiles.find(currentRefId);

        // if no writer associated with this value
        if (writerIter == outputFiles.end()) {

            // fetch reference name for ID
            std::string refName;
            if (currentRefId == -1)
                refName = "unmapped";
            else
                refName = m_references.at(currentRefId).RefName;

            // construct new output filename
            const std::string outputFilename = m_outputFilenameStub + refPrefix + refName + ".bam";

            // open new BamWriter
            writer = new BamWriter;
            if (!writer->Open(outputFilename, m_header, m_references)) {
                std::cerr << "bamtools split ERROR: could not open " << outputFilename
                          << " for writing." << std::endl;
                return false;
            }

            // store in map
            outputFiles.insert(std::make_pair(currentRefId, writer));
        }

        // else grab corresponding writer
        else
            writer = (*writerIter).second;

        // store alignment in proper BAM output file
        if (writer) writer->SaveAlignment(al);
    }

    // clean up BamWriters
    CloseWriters(outputFiles);

    // return success
    return true;
}